

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol_p.h
# Opt level: O0

QString * __thiscall QWidgetLineControl::inputMask(QWidgetLineControl *this)

{
  bool bVar1;
  QChar *rhs;
  long in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *mask;
  QString *pQVar2;
  QChar local_c;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = in_RDI;
  QString::QString((QString *)0x5cca71);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                      *)0x5cca82);
  if (bVar1) {
    QString::operator=(in_RDI,(QString *)(in_RSI + 200));
    rhs = (QChar *)(in_RSI + 0xe0);
    QChar::QChar<char16_t,_true>(&local_a,L' ');
    bVar1 = ::operator!=((QChar *)in_RDI,rhs);
    if (bVar1) {
      QChar::QChar<char16_t,_true>(&local_c,L';');
      QString::operator+=(in_RDI,(QChar)(char16_t)((ulong)pQVar2 >> 0x30));
      QString::operator+=(in_RDI,(QChar)(char16_t)((ulong)pQVar2 >> 0x30));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QString inputMask() const
    {
        QString mask;
        if (m_maskData) {
            mask = m_inputMask;
            if (m_blank != u' ') {
                mask += u';';
                mask += m_blank;
            }
        }
        return mask;
    }